

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O3

double quick_select_double(double *arr,int n)

{
  double dVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  double t;
  double dVar11;
  double t_2;
  double dVar12;
  
  uVar4 = n - 1;
  iVar3 = (n - ((int)uVar4 >> 0x1f)) + -1 >> 1;
  if (1 < n) {
    iVar5 = 0;
    do {
      uVar9 = iVar5 + 1;
      uVar6 = (ulong)uVar9;
      if (uVar4 == uVar9) {
        dVar12 = arr[iVar5];
        if (arr[(int)uVar4] < dVar12) {
          arr[iVar5] = arr[(int)uVar4];
          arr[(int)uVar4] = dVar12;
        }
        break;
      }
      iVar7 = (int)(iVar5 + uVar4) / 2;
      dVar12 = arr[iVar7];
      dVar11 = arr[(int)uVar4];
      if (dVar11 < dVar12) {
        arr[iVar7] = dVar11;
        arr[(int)uVar4] = dVar12;
        dVar11 = dVar12;
      }
      dVar12 = arr[iVar5];
      if (dVar11 < dVar12) {
        arr[iVar5] = dVar11;
        arr[(int)uVar4] = dVar12;
        dVar12 = arr[iVar5];
      }
      dVar11 = arr[iVar7];
      if (dVar12 < dVar11) {
        arr[iVar7] = dVar12;
        arr[iVar5] = dVar11;
        dVar11 = arr[iVar7];
      }
      arr[iVar7] = arr[(int)uVar9];
      arr[(int)uVar9] = dVar11;
      uVar9 = uVar4;
      while( true ) {
        dVar12 = arr[iVar5];
        uVar6 = (ulong)(int)uVar6;
        do {
          dVar11 = arr[uVar6 + 1];
          uVar6 = uVar6 + 1;
        } while (dVar11 < dVar12);
        lVar2 = (long)(int)uVar9 + 1;
        do {
          uVar8 = uVar9;
          lVar10 = lVar2;
          dVar1 = arr[lVar10 + -2];
          uVar9 = uVar8 - 1;
          lVar2 = lVar10 + -1;
        } while (dVar12 < dVar1);
        if (lVar10 + -1 <= (long)uVar6) break;
        arr[uVar6] = dVar1;
        arr[lVar10 + -2] = dVar11;
      }
      arr[iVar5] = dVar1;
      arr[lVar10 + -2] = dVar12;
      if ((int)uVar9 <= iVar3) {
        iVar5 = (int)uVar6;
      }
      if (iVar3 < (int)uVar8) {
        uVar4 = uVar8 - 2;
      }
    } while (iVar5 < (int)uVar4);
  }
  return arr[iVar3];
}

Assistant:

static double quick_select_double(double arr[], int n) 
{
    int low, high ;
    int median;
    int middle, ll, hh;

    low = 0 ; high = n-1 ; median = (low + high) / 2;
    for (;;) {
        if (high <= low) /* One element only */
            return arr[median] ;

        if (high == low + 1) {  /* Two elements only */
            if (arr[low] > arr[high])
                ELEM_SWAP(arr[low], arr[high]) ;
            return arr[median] ;
        }

    /* Find median of low, middle and high items; swap into position low */
    middle = (low + high) / 2;
    if (arr[middle] > arr[high])    ELEM_SWAP(arr[middle], arr[high]) ;
    if (arr[low] > arr[high])       ELEM_SWAP(arr[low], arr[high]) ;
    if (arr[middle] > arr[low])     ELEM_SWAP(arr[middle], arr[low]) ;

    /* Swap low item (now in position middle) into position (low+1) */
    ELEM_SWAP(arr[middle], arr[low+1]) ;

    /* Nibble from each end towards middle, swapping items when stuck */
    ll = low + 1;
    hh = high;
    for (;;) {
        do ll++; while (arr[low] > arr[ll]) ;
        do hh--; while (arr[hh]  > arr[low]) ;

        if (hh < ll)
        break;

        ELEM_SWAP(arr[ll], arr[hh]) ;
    }

    /* Swap middle item (in position low) back into correct position */
    ELEM_SWAP(arr[low], arr[hh]) ;

    /* Re-set active partition */
    if (hh <= median)
        low = ll;
        if (hh >= median)
        high = hh - 1;
    }
}